

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall CVmObjByteArray::write_to_data_file(CVmObjByteArray *this,CVmDataSource *fp)

{
  uint32_t tmp;
  int iVar1;
  int iVar2;
  char buf [16];
  undefined4 local_28 [6];
  
  local_28[0] = *(undefined4 *)(this->super_CVmObject).ext_;
  iVar1 = (*fp->_vptr_CVmDataSource[4])(fp,local_28,4);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar2 = write_to_file(this,fp,1,(ulong)*(uint *)(this->super_CVmObject).ext_);
  }
  return iVar2;
}

Assistant:

int CVmObjByteArray::write_to_data_file(CVmDataSource *fp)
{
    char buf[16];

    /* write the number of bytes in our array */
    oswp4(buf, get_element_count());
    if (fp->write(buf, 4))
        return 1;

    /* write the bytes */
    return write_to_file(fp, 1, get_element_count());
}